

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O3

IOTHUB_DEVICE_CLIENT_LL_HANDLE
create_device_client
          (BACK_COMPAT_INFO *back_compat_info,DEVICE_CREATION_TYPE type,
          IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  int iVar1;
  IOTHUB_PROVISIONED_DEVICE *pIVar2;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE iotHubClientHandle;
  TRANSPORT_HANDLE pTVar3;
  LOGGER_LOG p_Var4;
  IOTHUB_CLIENT_CONFIG client_config;
  IOTHUB_CLIENT_CONFIG local_78;
  IOTHUB_CLIENT_DEVICE_CONFIG local_40;
  
  pIVar2 = IoTHubAccount_GetSASDevice(back_compat_info->acct_info);
  if (type == DEVICE_CREATION_WITH_TRANSPORT) {
    local_78.iotHubName = (char *)0x0;
    local_78.iotHubSuffix = (char *)0x0;
    local_78.deviceKey = (char *)0x0;
    local_78.deviceSasToken = (char *)0x0;
    local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
    local_78.deviceId = (char *)0x0;
    local_78.protocolGatewayHostName = (char *)0x0;
    iVar1 = parse_connection_string((IOTHUB_PROVISIONED_DEVICE *)pIVar2->connectionString,&local_78)
    ;
    if (iVar1 == 0) {
      pTVar3 = IoTHubTransport_Create(protocol,local_78.iotHubName,local_78.iotHubSuffix);
      back_compat_info->transport_handle = pTVar3;
      if (pTVar3 == (TRANSPORT_HANDLE)0x0) {
        local_40.deviceId = local_78.deviceId;
        local_40.deviceKey = local_78.deviceKey;
        local_40.transportHandle = (void *)0x0;
        local_40.protocol = protocol;
        IoTHubDeviceClient_LL_CreateWithTransport(&local_40);
      }
      cleanup_config_object(&local_78);
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"create_device_client",0x15b,1,"Failure parsing connection string");
      }
    }
LAB_0011d4e6:
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"create_device_client",0x16f,1,"Failure unknown creation type %d",type);
      return (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
    }
  }
  else {
    if (type == DEVICE_CREATION_CREATE) {
      local_78.iotHubName = (char *)0x0;
      local_78.iotHubSuffix = (char *)0x0;
      local_78.deviceKey = (char *)0x0;
      local_78.deviceSasToken = (char *)0x0;
      local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
      local_78.deviceId = (char *)0x0;
      local_78.protocolGatewayHostName = (char *)0x0;
      iVar1 = parse_connection_string
                        ((IOTHUB_PROVISIONED_DEVICE *)pIVar2->connectionString,&local_78);
      if (iVar1 == 0) {
        local_78.protocol = protocol;
        iotHubClientHandle = IoTHubDeviceClient_LL_Create(&local_78);
        cleanup_config_object(&local_78);
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          iotHubClientHandle = (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
        }
        else {
          iotHubClientHandle = (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"create_device_client",0x14b,1,"Failure parsing connection string");
        }
      }
    }
    else {
      if (type != DEVICE_CREATION_CONN_STRING) goto LAB_0011d4e6;
      iotHubClientHandle =
           IoTHubDeviceClient_LL_CreateFromConnectionString(pIVar2->connectionString,protocol);
    }
    if (iotHubClientHandle != (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
      local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)CONCAT71(local_78.protocol._1_7_,1);
      IoTHubDeviceClient_LL_SetOption(iotHubClientHandle,"logtrace",&local_78);
      return iotHubClientHandle;
    }
  }
  return (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
}

Assistant:

static IOTHUB_DEVICE_CLIENT_LL_HANDLE create_device_client(BACK_COMPAT_INFO* back_compat_info, DEVICE_CREATION_TYPE type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_DEVICE_CLIENT_LL_HANDLE result;

    IOTHUB_PROVISIONED_DEVICE* device_info = IoTHubAccount_GetSASDevice(back_compat_info->acct_info);

    switch (type)
    {
        case DEVICE_CREATION_CONN_STRING:
            result = IoTHubDeviceClient_LL_CreateFromConnectionString(device_info->connectionString, protocol);
            break;
        case DEVICE_CREATION_CREATE:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                client_config.protocol = protocol;
                result = IoTHubDeviceClient_LL_Create(&client_config);
                cleanup_config_object(&client_config);
            }
            break;
        }
        case DEVICE_CREATION_WITH_TRANSPORT:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                if ((back_compat_info->transport_handle = IoTHubTransport_Create(protocol, client_config.iotHubName, client_config.iotHubSuffix)) == NULL)
                {
                    IOTHUB_CLIENT_DEVICE_CONFIG device_config;
                    device_config.deviceId = client_config.deviceId;
                    device_config.deviceKey = client_config.deviceKey;
                    device_config.protocol = protocol;
                    device_config.transportHandle = back_compat_info->transport_handle;

                    result = IoTHubDeviceClient_LL_CreateWithTransport(&device_config);
                }
                cleanup_config_object(&client_config);
            }
        }
        default:
        {
            LogError("Failure unknown creation type %d", (int)type);
            result = NULL;
            break;
        }
    }
    // Always set the log trace option
    if (result != NULL)
    {
        bool trace_on = true;
        IoTHubDeviceClient_LL_SetOption(result, OPTION_LOG_TRACE, &trace_on);
    }
    return result;
}